

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 this;
  bool bVar1;
  int iVar2;
  __pid_t _Var3;
  uint uVar4;
  FILE *__stream;
  size_type __n;
  size_t sVar5;
  clock_t cVar6;
  clock_t cVar7;
  _Rb_tree_node_base *p_Var8;
  tuple<google::CapturedStream_*,_std::default_delete<google::CapturedStream>_> tVar9;
  ostream *poVar10;
  string *psVar11;
  char *pcVar12;
  Logger *pLVar13;
  Logger *pLVar14;
  int *piVar15;
  char *pcVar16;
  ulong uVar17;
  long lVar18;
  char *__format;
  char *pcVar19;
  SendMethod in_R9;
  SendMethod SVar20;
  ulong uVar21;
  _Head_base<0UL,_google::CapturedStream_*,_false> _Var22;
  undefined8 *puVar23;
  string dest_1;
  unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_> cap;
  long alStack_2e0 [11];
  CheckOpString local_288 [2];
  vector<char,_std::allocator<char>_> content;
  string prefix_attacher_data;
  string early_stderr;
  
  fLB::FLAGS_colorlogtostderr = 0;
  fLB::FLAGS_timestamp_in_logfile_name = 1;
  setbuf(_stderr,(char *)0x0);
  google::CaptureTestStderr();
  LogWithLevels(fLI::FLAGS_v,fLI::FLAGS_stderrthreshold,(bool)fLB::FLAGS_logtostderr,
                (bool)fLB::FLAGS_alsologtostderr);
  LogWithLevels(0,0,false,false);
  this = google::s_captured_streams._16_8_;
  cap._M_t.
  super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>._M_t.
  super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>.
  super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<google::CapturedStream,_std::default_delete<google::CapturedStream>,_true,_true>
        )(__uniq_ptr_data<google::CapturedStream,_std::default_delete<google::CapturedStream>,_true,_true>
          )google::s_captured_streams._16_8_;
  google::s_captured_streams._16_8_ = 0;
  if (this == 0) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&content,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x183);
    poVar10 = google::LogMessage::stream((LogMessage *)&content);
    poVar10 = std::operator<<(poVar10,"Check failed: cap ");
    std::operator<<(poVar10,": did you forget CaptureTestStdout() or CaptureTestStderr()?");
    goto LAB_0010b997;
  }
  google::CapturedStream::StopCapture((CapturedStream *)this);
  __stream = fopen(*(char **)((long)cap._M_t.
                                    super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                                    .super__Head_base<0UL,_google::CapturedStream_*,_false>.
                                    _M_head_impl + 8),"r");
  dest_1._M_dataplus._M_p = (pointer)__stream;
  fseek(__stream,0,2);
  __n = ftell(__stream);
  std::vector<char,_std::allocator<char>_>::vector
            (&content,__n,(allocator_type *)&prefix_attacher_data);
  uVar21 = 0;
  fseek(__stream,0,0);
  do {
    sVar5 = fread(content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar21,1,__n - uVar21,__stream);
    uVar21 = uVar21 + sVar5;
    if (sVar5 == 0) break;
  } while (uVar21 < __n);
  early_stderr._M_dataplus._M_p = (pointer)&early_stderr.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&early_stderr,
             content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start,
             content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start + uVar21);
  free(content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start);
  std::__uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>::reset
            ((__uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_> *)&dest_1,(pointer)0x0);
  std::unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_>::~unique_ptr
            ((unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_> *)&dest_1);
  std::unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_>::~unique_ptr
            (&cap);
  bVar1 = google::IsGoogleLoggingInitialized();
  if (bVar1) {
LAB_0010b583:
    pcVar12 = "!(IsGoogleLoggingInitialized())";
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix_attacher_data,"good data",(allocator<char> *)&content);
    google::InitGoogleLogging(*argv,PrefixAttacher,&prefix_attacher_data);
    bVar1 = google::IsGoogleLoggingInitialized();
    uVar4 = fLI::FLAGS_benchmark_iters;
    if (bVar1) {
      if (fLB::FLAGS_run_benchmark == '\x01') {
        puts("Benchmark\tTime(ns)\tIterations");
        for (p_Var8 = (_Rb_tree_node_base *)google::g_benchlist_abi_cxx11_._24_8_;
            p_Var8 != (_Rb_tree_node_base *)(google::g_benchlist_abi_cxx11_ + 8);
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          cVar6 = clock();
          (**(code **)(p_Var8 + 2))(uVar4);
          cVar7 = clock();
          printf("%s\t%8.2lf\t%10d\n",
                 ((((double)cVar7 - (double)cVar6) / 1000000.0) * 1000.0 * 1000.0 * 1000.0) /
                 (double)(int)uVar4,*(undefined8 *)(p_Var8 + 1),(ulong)uVar4);
        }
        putchar(10);
      }
      fLB::FLAGS_logtostderr = 1;
      lVar18 = -(long)google::g_testlist;
      for (puVar23 = google::g_testlist; puVar23 != DAT_0013fb50; puVar23 = puVar23 + 1) {
        (*(code *)*puVar23)();
        lVar18 = lVar18 + -8;
      }
      fprintf(_stderr,"Passed %d tests\n\nPASS\n",
              (ulong)-(lVar18 + (long)google::g_testlist) >> 3 & 0xffffffff);
      tVar9.
      super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
      .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
           )google::Check_EQImpl_abi_cxx11_(0,0,"RUN_ALL_TESTS() == 0");
      if (tVar9.
          super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
          .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl !=
          (_Head_base<0UL,_google::CapturedStream_*,_false>)0x0) {
        cap._M_t.
        super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>.
        _M_t.
        super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
        .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl =
             (__uniq_ptr_data<google::CapturedStream,_std::default_delete<google::CapturedStream>,_true,_true>
              )(__uniq_ptr_data<google::CapturedStream,_std::default_delete<google::CapturedStream>,_true,_true>
                )tVar9.
                 super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                 .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl;
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&content,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0xf3,(CheckOpString *)&cap);
        google::LogMessage::stream((LogMessage *)&content);
        goto LAB_0010b997;
      }
      google::CaptureTestStderr();
      google::LogMessage::LogMessage((LogMessage *)&content,"dummy",-1,GLOG_INFO);
      poVar10 = google::LogMessage::stream((LogMessage *)&content);
      std::operator<<(poVar10,(string *)&early_stderr);
      google::LogMessage::~LogMessage((LogMessage *)&content);
      TestLogging(true);
      TestRawLogging();
      TestLoggingLevels();
      iVar2 = TestVlogHelper();
      if (iVar2 == 0) {
        iVar2 = google::SetVLOGLevel("logging_unittest",1);
        if (iVar2 == 0) {
          iVar2 = TestVlogHelper();
          if (iVar2 != 0) {
            TestLogString();
            TestLogSink();
            TestLogToString();
            TestLogSinkWaitTillSent();
            TestCHECK();
            TestDCHECK();
            TestSTREQ();
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &content,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)fLS::FLAGS_test_srcdir_buf_abi_cxx11_,
                           "/src/logging_unittest.err");
            bVar1 = google::MungeAndDiffTest
                              ((string *)&content,
                               (CapturedStream *)google::s_captured_streams._16_8_);
            std::__cxx11::string::~string((string *)&content);
            if (bVar1) {
              fLB::FLAGS_logtostderr = 0;
              fLB::FLAGS_logtostdout = 1;
              fLI::FLAGS_stderrthreshold = 4;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &content,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,"/captured.out");
              google::CaptureTestOutput(1,(string *)&content);
              std::__cxx11::string::~string((string *)&content);
              TestRawLogging();
              TestLoggingLevels();
              TestLogString();
              TestLogSink();
              TestLogToString();
              TestLogSinkWaitTillSent();
              TestCHECK();
              TestDCHECK();
              TestSTREQ();
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &content,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)fLS::FLAGS_test_srcdir_buf_abi_cxx11_,
                             "/src/logging_unittest.out");
              bVar1 = google::MungeAndDiffTest
                                ((string *)&content,
                                 (CapturedStream *)google::s_captured_streams._8_8_);
              std::__cxx11::string::~string((string *)&content);
              if (bVar1) {
                fLB::FLAGS_logtostdout = 0;
                fwrite("==== Test setting log file basename\n",0x24,1,_stderr);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &cap,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
                               "/logging_test_basename");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &content,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&cap,"*");
                DeleteFiles((string *)&content);
                std::__cxx11::string::~string((string *)&content);
                google::SetLogDestination
                          (GLOG_INFO,
                           (char *)cap._M_t.
                                   super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                                   .super__Head_base<0UL,_google::CapturedStream_*,_false>.
                                   _M_head_impl);
                google::LogMessage::LogMessage
                          ((LogMessage *)&content,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                           ,0x329);
                poVar10 = google::LogMessage::stream((LogMessage *)&content);
                std::operator<<(poVar10,"message to new base");
                google::LogMessage::~LogMessage((LogMessage *)&content);
                google::FlushLogFiles(GLOG_INFO);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&content,"message to new base",(allocator<char> *)&dest_1);
                CheckFile((string *)&cap,(string *)&content,true);
                std::__cxx11::string::~string((string *)&content);
                google::LogToStderr();
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &content,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&cap,"*");
                DeleteFiles((string *)&content);
                std::__cxx11::string::~string((string *)&content);
                std::__cxx11::string::~string((string *)&cap);
                fwrite("==== Test setting log file basename without timestamp and appending properly\n"
                       ,0x4d,1,_stderr);
                std::operator+(&dest_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
                               "/logging_test_basename_append_when_no_timestamp");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &content,&dest_1,"*");
                DeleteFiles((string *)&content);
                std::__cxx11::string::~string((string *)&content);
                std::ofstream::ofstream(&content,dest_1._M_dataplus._M_p,_S_out);
                poVar10 = std::operator<<((ostream *)&content,"test preexisting content");
                std::endl<char,std::char_traits<char>>(poVar10);
                std::ofstream::close();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&cap,"test preexisting content",(allocator<char> *)local_288);
                CheckFile(&dest_1,(string *)&cap,true);
                std::__cxx11::string::~string((string *)&cap);
                fLB::FLAGS_timestamp_in_logfile_name = 0;
                google::SetLogDestination(GLOG_INFO,dest_1._M_dataplus._M_p);
                google::LogMessage::LogMessage
                          ((LogMessage *)&cap,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                           ,0x343);
                poVar10 = google::LogMessage::stream((LogMessage *)&cap);
                std::operator<<(poVar10,"message to new base, appending to preexisting file");
                google::LogMessage::~LogMessage((LogMessage *)&cap);
                google::FlushLogFiles(GLOG_INFO);
                fLB::FLAGS_timestamp_in_logfile_name = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&cap,"test preexisting content",(allocator<char> *)local_288);
                CheckFile(&dest_1,(string *)&cap,true);
                std::__cxx11::string::~string((string *)&cap);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&cap,"message to new base, appending to preexisting file",
                           (allocator<char> *)local_288);
                CheckFile(&dest_1,(string *)&cap,true);
                std::__cxx11::string::~string((string *)&cap);
                google::LogToStderr();
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &cap,&dest_1,"*");
                DeleteFiles((string *)&cap);
                std::__cxx11::string::~string((string *)&cap);
                std::ofstream::~ofstream(&content);
                std::__cxx11::string::~string((string *)&dest_1);
                fwrite("==== Test setting log file basename and two processes writing - second should fail\n"
                       ,0x53,1,_stderr);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &cap,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
                               "/logging_test_basename_two_processes_writing");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &content,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&cap,"*");
                DeleteFiles((string *)&content);
                std::__cxx11::string::~string((string *)&content);
                fLB::FLAGS_timestamp_in_logfile_name = 0;
                google::SetLogDestination
                          (GLOG_INFO,
                           (char *)cap._M_t.
                                   super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                                   .super__Head_base<0UL,_google::CapturedStream_*,_false>.
                                   _M_head_impl);
                google::LogMessage::LogMessage
                          ((LogMessage *)&content,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                           ,0x35e);
                poVar10 = google::LogMessage::stream((LogMessage *)&content);
                std::operator<<(poVar10,"message to new base, parent");
                google::LogMessage::~LogMessage((LogMessage *)&content);
                google::FlushLogFiles(GLOG_INFO);
                _Var3 = fork();
                if (_Var3 == 0) {
                  google::LogMessage::LogMessage
                            ((LogMessage *)&content,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                             ,0x364);
                  poVar10 = google::LogMessage::stream((LogMessage *)&content);
                  std::operator<<(poVar10,
                                  "message to new base, child - should only appear on STDERR not on the file"
                                 );
                  google::LogMessage::~LogMessage((LogMessage *)&content);
                  google::ShutdownGoogleLogging();
                  exit(0);
                }
                if (_Var3 == -1) {
                  dest_1._M_dataplus._M_p = (pointer)google::LogMessage::SendToLog;
                  dest_1._M_string_length = 0;
                  google::ErrnoLogMessage::ErrnoLogMessage
                            ((ErrnoLogMessage *)&content,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                             ,0x362,FATAL,0,in_R9);
                  poVar10 = google::LogMessage::stream((LogMessage *)&content);
                  std::operator<<(poVar10,"pid");
                  google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&content);
                }
                else if (0 < _Var3) {
                  wait((void *)0x0);
                }
                fLB::FLAGS_timestamp_in_logfile_name = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&content,"message to new base, parent",
                           (allocator<char> *)&dest_1);
                CheckFile((string *)&cap,(string *)&content,true);
                std::__cxx11::string::~string((string *)&content);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&content,
                           "message to new base, child - should only appear on STDERR not on the file"
                           ,(allocator<char> *)&dest_1);
                CheckFile((string *)&cap,(string *)&content,false);
                std::__cxx11::string::~string((string *)&content);
                google::LogToStderr();
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &content,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&cap,"*");
                DeleteFiles((string *)&content);
                std::__cxx11::string::~string((string *)&content);
                std::__cxx11::string::~string((string *)&cap);
                fwrite("==== Test setting log file symlink\n",0x23,1,_stderr);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &cap,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,"/logging_test_symlink"
                              );
                std::operator+(&dest_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,"/symlinkbase");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &content,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&cap,"*");
                DeleteFiles((string *)&content);
                std::__cxx11::string::~string((string *)&content);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &content,&dest_1,"*");
                DeleteFiles((string *)&content);
                std::__cxx11::string::~string((string *)&content);
                google::SetLogSymlink(GLOG_INFO,"symlinkbase");
                google::SetLogDestination
                          (GLOG_INFO,
                           (char *)cap._M_t.
                                   super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                                   .super__Head_base<0UL,_google::CapturedStream_*,_false>.
                                   _M_head_impl);
                google::LogMessage::LogMessage
                          ((LogMessage *)&content,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                           ,899);
                poVar10 = google::LogMessage::stream((LogMessage *)&content);
                std::operator<<(poVar10,"message to new symlink");
                google::LogMessage::~LogMessage((LogMessage *)&content);
                google::FlushLogFiles(GLOG_INFO);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&content,"message to new symlink",(allocator<char> *)local_288)
                ;
                CheckFile(&dest_1,(string *)&content,true);
                std::__cxx11::string::~string((string *)&content);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &content,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&cap,"*");
                DeleteFiles((string *)&content);
                std::__cxx11::string::~string((string *)&content);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &content,&dest_1,"*");
                DeleteFiles((string *)&content);
                std::__cxx11::string::~string((string *)&content);
                std::__cxx11::string::~string((string *)&dest_1);
                std::__cxx11::string::~string((string *)&cap);
                fwrite("==== Test setting log file extension\n",0x25,1,_stderr);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &cap,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
                               "/logging_test_extension");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &content,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&cap,"*");
                DeleteFiles((string *)&content);
                std::__cxx11::string::~string((string *)&content);
                google::SetLogDestination
                          (GLOG_INFO,
                           (char *)cap._M_t.
                                   super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                                   .super__Head_base<0UL,_google::CapturedStream_*,_false>.
                                   _M_head_impl);
                google::SetLogFilenameExtension("specialextension");
                google::LogMessage::LogMessage
                          ((LogMessage *)&content,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                           ,0x393);
                poVar10 = google::LogMessage::stream((LogMessage *)&content);
                std::operator<<(poVar10,"message to new extension");
                google::LogMessage::~LogMessage((LogMessage *)&content);
                google::FlushLogFiles(GLOG_INFO);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&content,"message to new extension",(allocator<char> *)&dest_1)
                ;
                CheckFile((string *)&cap,(string *)&content,true);
                std::__cxx11::string::~string((string *)&content);
                dest_1._M_dataplus._M_p = (pointer)0x0;
                dest_1._M_string_length = 0;
                dest_1.field_2._M_allocated_capacity = 0;
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &content,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&cap,"*");
                GetFiles((string *)&content,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&dest_1);
                std::__cxx11::string::~string((string *)&content);
                content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)((long)(dest_1._M_string_length - (long)dest_1._M_dataplus._M_p) >> 5)
                ;
                local_288[0].str_ = (string *)0x1;
                psVar11 = google::Check_EQImpl<unsigned_long,unsigned_long>
                                    ((unsigned_long *)&content,(unsigned_long *)local_288,
                                     "filenames.size() == 1UL");
                if (psVar11 != (string *)0x0) {
                  local_288[0].str_ = psVar11;
                  google::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&content,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                             ,0x39a,local_288);
                  google::LogMessage::stream((LogMessage *)&content);
LAB_0010b997:
                  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&content);
                }
                pcVar12 = strstr(*(char **)dest_1._M_dataplus._M_p,"specialextension");
                if (pcVar12 == (char *)0x0) {
                  google::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&content,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                             ,0x39b);
                  poVar10 = google::LogMessage::stream((LogMessage *)&content);
                  std::operator<<(poVar10,
                                  "Check failed: strstr(filenames[0].c_str(), \"specialextension\") != nullptr "
                                 );
                  goto LAB_0010b997;
                }
                google::LogToStderr();
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &content,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&cap,"*");
                DeleteFiles((string *)&content);
                std::__cxx11::string::~string((string *)&content);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&dest_1);
                std::__cxx11::string::~string((string *)&cap);
                fwrite("==== Test log wrapper\n",0x16,1,_stderr);
                cap._M_t.
                super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl =
                     (__uniq_ptr_data<google::CapturedStream,_std::default_delete<google::CapturedStream>,_true,_true>
                      )((ulong)cap._M_t.
                               super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                               .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl
                       & 0xffffffffffffff00);
                pLVar13 = (Logger *)operator_new(0x30);
                pLVar13->_vptr_Logger = (_func_int **)&PTR__MyLogger_0013e440;
                pLVar13[1]._vptr_Logger = (_func_int **)(pLVar13 + 3);
                pLVar13[2]._vptr_Logger = (_func_int **)0x0;
                *(undefined1 *)&pLVar13[3]._vptr_Logger = 0;
                pLVar13[5]._vptr_Logger = (_func_int **)&cap;
                pLVar14 = google::base::GetLogger(GLOG_INFO);
                google::base::SetLogger(GLOG_INFO,pLVar13);
                google::LogMessage::LogMessage
                          ((LogMessage *)&content,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                           ,0x3bf);
                poVar10 = google::LogMessage::stream((LogMessage *)&content);
                std::operator<<(poVar10,"Send to wrapped logger");
                google::LogMessage::~LogMessage((LogMessage *)&content);
                pcVar12 = strstr((char *)pLVar13[1]._vptr_Logger,"Send to wrapped logger");
                if (pcVar12 == (char *)0x0) {
                  google::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&content,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                             ,0x3c0);
                  poVar10 = google::LogMessage::stream((LogMessage *)&content);
                  std::operator<<(poVar10,
                                  "Check failed: strstr(my_logger->data.c_str(), \"Send to wrapped logger\") != nullptr "
                                 );
                  goto LAB_0010b997;
                }
                google::FlushLogFiles(GLOG_INFO);
                if ((char)cap._M_t.
                          super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                          .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl ==
                    '\x01') {
                  pcVar12 = "!(custom_logger_deleted)";
                }
                else {
                  google::base::SetLogger(GLOG_INFO,pLVar14);
                  if ((char)cap._M_t.
                            super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                            .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl !=
                      '\0') {
                    fwrite("==== Test errno preservation\n",0x1d,1,_stderr);
                    piVar15 = __errno_location();
                    *piVar15 = 2;
                    TestLogging(false);
                    tVar9.
                    super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                    .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl =
                         (_Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                          )google::Check_EQImpl_abi_cxx11_(*piVar15,2,"(*__errno_location ()) == 2")
                    ;
                    if (tVar9.
                        super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                        .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl !=
                        (_Head_base<0UL,_google::CapturedStream_*,_false>)0x0) {
                      cap._M_t.
                      super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                      .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl =
                           (__uniq_ptr_data<google::CapturedStream,_std::default_delete<google::CapturedStream>,_true,_true>
                            )(__uniq_ptr_data<google::CapturedStream,_std::default_delete<google::CapturedStream>,_true,_true>
                              )tVar9.
                               super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                               .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl;
                      google::LogMessageFatal::LogMessageFatal
                                ((LogMessageFatal *)&content,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                                 ,0x3cd,(CheckOpString *)&cap);
                      google::LogMessage::stream((LogMessage *)&content);
                      goto LAB_0010b997;
                    }
                    fwrite("==== Test log truncation\n",0x19,1,_stderr);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&cap,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,"/truncatefile")
                    ;
                    TestOneTruncate((char *)cap._M_t.
                                            super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                                            .super__Head_base<0UL,_google::CapturedStream_*,_false>.
                                            _M_head_impl,10,10,10,10,10);
                    TestOneTruncate((char *)cap._M_t.
                                            super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                                            .super__Head_base<0UL,_google::CapturedStream_*,_false>.
                                            _M_head_impl,0x200000,0x1000,0x300000,0x1000,0x1000);
                    TestOneTruncate((char *)cap._M_t.
                                            super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                                            .super__Head_base<0UL,_google::CapturedStream_*,_false>.
                                            _M_head_impl,10,0x14,0,0x14,0x14);
                    TestOneTruncate((char *)cap._M_t.
                                            super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                                            .super__Head_base<0UL,_google::CapturedStream_*,_false>.
                                            _M_head_impl,10,0,0,0,0);
                    TestOneTruncate((char *)cap._M_t.
                                            super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                                            .super__Head_base<0UL,_google::CapturedStream_*,_false>.
                                            _M_head_impl,10,0x32,0,10,10);
                    SVar20 = 0x1e;
                    TestOneTruncate((char *)cap._M_t.
                                            super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                                            .super__Head_base<0UL,_google::CapturedStream_*,_false>.
                                            _M_head_impl,0x32,100,0,0x1e,0x1e);
                    std::operator+(&dest_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&cap,".link");
                    unlink(dest_1._M_dataplus._M_p);
                    iVar2 = symlink((char *)cap._M_t.
                                            super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                                            .super__Head_base<0UL,_google::CapturedStream_*,_false>.
                                            _M_head_impl,dest_1._M_dataplus._M_p);
                    if (iVar2 == -1) {
                      local_288[0].str_ = (string *)google::LogMessage::SendToLog;
                      local_288[1].str_ = (string *)0x0;
                      google::ErrnoLogMessage::ErrnoLogMessage
                                ((ErrnoLogMessage *)&content,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                                 ,0x415,FATAL,0,SVar20);
                      poVar10 = google::LogMessage::stream((LogMessage *)&content);
                      std::operator<<(poVar10,"symlink(path.c_str(), linkname.c_str())");
                      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&content);
                    }
                    SVar20 = 0x1e;
                    TestOneTruncate(dest_1._M_dataplus._M_p,10,10,0,0x1e,0x1e);
                    uVar4 = open((char *)cap._M_t.
                                         super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                                         .super__Head_base<0UL,_google::CapturedStream_*,_false>.
                                         _M_head_impl,0x401);
                    if (uVar4 == 0xffffffff) {
                      local_288[0].str_ = (string *)google::LogMessage::SendToLog;
                      local_288[1].str_ = (string *)0x0;
                      google::ErrnoLogMessage::ErrnoLogMessage
                                ((ErrnoLogMessage *)&content,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                                 ,0x41d,FATAL,0,SVar20);
                      poVar10 = google::LogMessage::stream((LogMessage *)&content);
                      std::operator<<(poVar10,"fd = open(path.c_str(), O_APPEND | O_WRONLY)");
                      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&content);
                    }
                    snprintf((char *)&content,0x40,"/proc/self/fd/%d",(ulong)uVar4);
                    TestOneTruncate((char *)&content,10,10,10,10,10);
                    std::__cxx11::string::~string((string *)&dest_1);
                    std::__cxx11::string::~string((string *)&cap);
                    pLVar13 = (Logger *)operator_new(0x18);
                    pLVar14 = google::base::GetLogger(GLOG_INFO);
                    pLVar13->_vptr_Logger = (_func_int **)&PTR__RecordDeletionLogger_0013e498;
                    pLVar13[1]._vptr_Logger = (_func_int **)&content;
                    pLVar13[2]._vptr_Logger = (_func_int **)pLVar14;
                    content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         (pointer)((ulong)content.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.super__Vector_impl_data._M_start &
                                  0xffffffffffffff00);
                    google::base::SetLogger(GLOG_INFO,pLVar13);
                    bVar1 = google::IsGoogleLoggingInitialized();
                    if (!bVar1) goto LAB_0010b59a;
                    google::ShutdownGoogleLogging();
                    if ((char)content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start != '\0') {
                      bVar1 = google::IsGoogleLoggingInitialized();
                      if (bVar1) goto LAB_0010b583;
                      fwrite("==== Test log periodically\n",0x1b,1,_stderr);
                      cap._M_t.
                      super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                      .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl =
                           (__uniq_ptr_data<google::CapturedStream,_std::default_delete<google::CapturedStream>,_true,_true>
                            )(__uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                              )0x0;
                      _Var22._M_head_impl = (CapturedStream *)0x0;
                      while (_Var22._M_head_impl < 10) {
                        lVar18 = std::chrono::_V2::steady_clock::now();
                        if (10000000 < lVar18 - _ZZL19TestLogPeriodicallyvE20previousTimeRaw_1135_0)
                        {
                          _ZZL19TestLogPeriodicallyvE20previousTimeRaw_1135_0 = lVar18;
                          google::LogMessage::LogMessage
                                    ((LogMessage *)&content,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                                     ,0x46f,GLOG_INFO);
                          poVar10 = google::LogMessage::stream((LogMessage *)&content);
                          operator<<(poVar10,(LogTimeRecorder *)&cap);
                          poVar10 = std::operator<<(poVar10,"Timed Message #");
                          _Var22._M_head_impl = (CapturedStream *)cap;
                          std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                          google::LogMessage::~LogMessage((LogMessage *)&content);
                        }
                      }
                      for (lVar18 = 2; lVar18 != 0xb; lVar18 = lVar18 + 1) {
                        local_288[lVar18].str_ =
                             (string *)
                             (alStack_2e0[lVar18 + -1] -
                             *(long *)((long)&dest_1.field_2 + lVar18 * 8 + 8));
                      }
                      lVar18 = 0;
                      do {
                        if (lVar18 == 0x48) {
                          fwrite("PASS\n",5,1,_stdout);
                          std::__cxx11::string::~string((string *)&prefix_attacher_data);
                          std::__cxx11::string::~string((string *)&early_stderr);
                          return 0;
                        }
                        uVar17 = *(long *)((long)&content.
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar18)
                                 - 10000000;
                        uVar21 = -uVar17;
                        if (0 < (long)uVar17) {
                          uVar21 = uVar17;
                        }
                        lVar18 = lVar18 + 8;
                      } while (uVar21 < 0x7a121);
                      __format = "Check failed: %s within %s of %s\n";
                      pcVar12 = "time_ns";
                      pcVar16 = "LogTimes::LOG_PERIOD_TOL_NS";
                      pcVar19 = "LogTimes::LOG_PERIOD_NS";
                      goto LAB_0010b63a;
                    }
                  }
                  pcVar12 = "custom_logger_deleted";
                }
              }
              else {
                pcVar12 = 
                "MungeAndDiffTestStdout(FLAGS_test_srcdir + \"/src/logging_unittest.out\")";
              }
            }
            else {
              pcVar12 = "MungeAndDiffTestStderr(FLAGS_test_srcdir + \"/src/logging_unittest.err\")";
            }
            goto LAB_0010b6ca;
          }
          pcVar12 = "1";
          goto LAB_0010b62c;
        }
        __format = "Check failed: %s %s %s\n";
        pcVar12 = "0";
        pcVar16 = "==";
        pcVar19 = "SetVLOGLevel(\"logging_unittest\", 1)";
      }
      else {
        pcVar12 = "0";
LAB_0010b62c:
        __format = "Check failed: %s %s %s\n";
        pcVar16 = "==";
        pcVar19 = "c";
      }
LAB_0010b63a:
      fprintf(_stderr,__format,pcVar12,pcVar16,pcVar19);
      goto LAB_0010b6d1;
    }
LAB_0010b59a:
    pcVar12 = "IsGoogleLoggingInitialized()";
  }
LAB_0010b6ca:
  fprintf(_stderr,"Check failed: %s\n",pcVar12);
LAB_0010b6d1:
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
  FLAGS_colorlogtostderr = false;
  FLAGS_timestamp_in_logfile_name = true;

  // Make sure stderr is not buffered as stderr seems to be buffered
  // on recent windows.
  setbuf(stderr, nullptr);

  // Test some basics before InitGoogleLogging:
  CaptureTestStderr();
  LogWithLevels(FLAGS_v, FLAGS_stderrthreshold, FLAGS_logtostderr,
                FLAGS_alsologtostderr);
  LogWithLevels(0, 0, false, false);  // simulate "before global c-tors"
  const string early_stderr = GetCapturedTestStderr();

  EXPECT_FALSE(IsGoogleLoggingInitialized());

  // Setting a custom prefix generator (it will use the default format so that
  // the golden outputs can be reused):
  string prefix_attacher_data = "good data";
  InitGoogleLogging(argv[0], &PrefixAttacher,
                    static_cast<void*>(&prefix_attacher_data));

  EXPECT_TRUE(IsGoogleLoggingInitialized());

  RunSpecifiedBenchmarks();

  FLAGS_logtostderr = true;

  InitGoogleTest(&argc, argv);
#ifdef HAVE_LIB_GMOCK
  InitGoogleMock(&argc, argv);
#endif

#ifdef GLOG_USE_GFLAGS
  ParseCommandLineFlags(&argc, &argv, true);
#endif

  // so that death tests run before we use threads
  CHECK_EQ(RUN_ALL_TESTS(), 0);

  CaptureTestStderr();

  // re-emit early_stderr
  LogMessage("dummy", LogMessage::kNoLogPrefix, GLOG_INFO).stream()
      << early_stderr;

  TestLogging(true);
  TestRawLogging();
  TestLoggingLevels();
  TestVLogModule();
  TestLogString();
  TestLogSink();
  TestLogToString();
  TestLogSinkWaitTillSent();
  TestCHECK();
  TestDCHECK();
  TestSTREQ();

  // TODO: The golden test portion of this test is very flakey.
  EXPECT_TRUE(
      MungeAndDiffTestStderr(FLAGS_test_srcdir + "/src/logging_unittest.err"));

  FLAGS_logtostderr = false;

  FLAGS_logtostdout = true;
  FLAGS_stderrthreshold = NUM_SEVERITIES;
  CaptureTestStdout();
  TestRawLogging();
  TestLoggingLevels();
  TestLogString();
  TestLogSink();
  TestLogToString();
  TestLogSinkWaitTillSent();
  TestCHECK();
  TestDCHECK();
  TestSTREQ();
  EXPECT_TRUE(
      MungeAndDiffTestStdout(FLAGS_test_srcdir + "/src/logging_unittest.out"));
  FLAGS_logtostdout = false;

  TestBasename();
  TestBasenameAppendWhenNoTimestamp();
  TestTwoProcessesWrite();
  TestSymlink();
  TestExtension();
  TestWrapper();
  TestErrno();
  TestTruncate();
  TestCustomLoggerDeletionOnShutdown();
  TestLogPeriodically();

  fprintf(stdout, "PASS\n");
  return 0;
}